

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O2

void __thiscall leveldb::anon_unknown_1::PosixFileLock::~PosixFileLock(PosixFileLock *this)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ~PosixFileLock(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    operator_delete(this,0x30);
    return;
  }
  __stack_chk_fail();
}

Assistant:

PosixFileLock(int fd, std::string filename)
      : fd_(fd), filename_(std::move(filename)) {}